

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O3

void do_cmd_wiz_banish(command *cmd)

{
  uint32_t *puVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  undefined8 in_RAX;
  monster *pmVar4;
  wchar_t d;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  wVar2 = cmd_get_arg_number((command_conflict *)cmd,"range",(int *)((long)&uStack_18 + 4));
  if (wVar2 != L'\0') {
    wVar2 = get_quantity("Zap within what distance? ",(uint)z_info->max_sight);
    uStack_18 = CONCAT44(wVar2,(undefined4)uStack_18);
    cmd_set_arg_number((command_conflict *)cmd,"range",wVar2);
  }
  wVar2 = cave_monster_max(cave);
  if (L'\x01' < wVar2) {
    wVar2 = L'\x01';
    do {
      pmVar4 = cave_monster(cave,wVar2);
      if ((pmVar4->race != (monster_race *)0x0) && ((int)(uint)pmVar4->cdis <= uStack_18._4_4_)) {
        delete_monster_idx(wVar2);
      }
      wVar2 = wVar2 + L'\x01';
      wVar3 = cave_monster_max(cave);
    } while (wVar2 < wVar3);
  }
  puVar1 = &player->upkeep->redraw;
  *puVar1 = *puVar1 | 0x400000;
  return;
}

Assistant:

void do_cmd_wiz_banish(struct command *cmd)
{
	int d, i;

	if (cmd_get_arg_number(cmd, "range", &d) != CMD_OK) {
		d = get_quantity("Zap within what distance? ",
			z_info->max_sight);
		cmd_set_arg_number(cmd, "range", d);
	}

	for (i = 1; i < cave_monster_max(cave); i++) {
		struct monster *mon = cave_monster(cave, i);

		/* Skip dead monsters */
		if (!mon->race) continue;

		/* Skip distant monsters */
		if (mon->cdis > d) continue;

		/* Delete the monster */
		delete_monster_idx(i);
	}

	/* Update monster list window */
	player->upkeep->redraw |= PR_MONLIST;
}